

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

bool __thiscall filesystem::path::is_directory(path *this)

{
  int iVar1;
  char *__file;
  undefined1 local_c8 [40];
  stat sb;
  path *this_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)this;
  str_abi_cxx11_((path *)local_c8,(path_type)this);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)(local_c8 + 0x20));
  std::__cxx11::string::~string((string *)local_c8);
  this_local._7_1_ = iVar1 == 0 && ((uint)sb.st_nlink & 0xf000) == 0x4000;
  return this_local._7_1_;
}

Assistant:

bool is_directory() const {
#if defined(_WIN32)
        DWORD result = GetFileAttributesW(wstr().c_str());
        if (result == INVALID_FILE_ATTRIBUTES)
            return false;
        return (result & FILE_ATTRIBUTE_DIRECTORY) != 0;
#else
        struct stat sb;
        if (stat(str().c_str(), &sb))
            return false;
        return S_ISDIR(sb.st_mode);
#endif
    }